

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_settings.cpp
# Opt level: O2

void duckdb::DuckDBSettingsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  _func_int **pp_Var3;
  _func_int **__n;
  _func_int **pp_Var4;
  ulong index;
  string local_110;
  string local_f0;
  Value local_d0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 0xa0)) {
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 0xa0) && (index < 0x800));
        index = index + 1) {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar2 = vector<duckdb::DuckDBSettingValue,_true>::get<true>
                         ((vector<duckdb::DuckDBSettingValue,_true> *)(pGVar1 + 1),(size_type)__n);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)pvVar2);
      Value::Value(&local_d0,&local_f0);
      DataChunk::SetValue(output,0,index,&local_d0);
      Value::~Value(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&pvVar2->value);
      Value::Value(&local_d0,&local_50);
      DataChunk::SetValue(output,1,index,&local_d0);
      Value::~Value(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::string((string *)&local_110,(string *)&pvVar2->description);
      Value::Value(&local_d0,&local_110);
      DataChunk::SetValue(output,2,index,&local_d0);
      Value::~Value(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&pvVar2->input_type);
      Value::Value(&local_d0,&local_70);
      DataChunk::SetValue(output,3,index,&local_d0);
      Value::~Value(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::string((string *)&local_90,(string *)&pvVar2->scope);
      Value::Value(&local_d0,&local_90);
      DataChunk::SetValue(output,4,index,&local_d0);
      Value::~Value(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_90);
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBSettingsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBSettingsData>();
	if (data.offset >= data.settings.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.settings.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.settings[data.offset++];

		// return values:
		// name, LogicalType::VARCHAR
		output.SetValue(0, count, Value(entry.name));
		// value, LogicalType::VARCHAR
		output.SetValue(1, count, Value(entry.value));
		// description, LogicalType::VARCHAR
		output.SetValue(2, count, Value(entry.description));
		// input_type, LogicalType::VARCHAR
		output.SetValue(3, count, Value(entry.input_type));
		// scope, LogicalType::VARCHAR
		output.SetValue(4, count, Value(entry.scope));
		count++;
	}
	output.SetCardinality(count);
}